

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLexer.cpp
# Opt level: O2

JsonToken * json::JsonLexer::nextToken(JsonToken *__return_storage_ptr__,istream *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  istream *piVar3;
  runtime_error *this;
  size_t __nbytes;
  size_t __nbytes_00;
  size_t __nbytes_01;
  int __fd;
  char c;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  piVar3 = std::operator>>(input,&c);
  if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
    __return_storage_ptr__->type = EndOfFile;
    goto LAB_00103427;
  }
  uVar2 = (uint)(byte)c;
  if (0x18 < uVar2 - 0x22) {
    if (uVar2 == 0x7d) {
      __return_storage_ptr__->type = EndObject;
    }
    else if (uVar2 == 0x5d) {
      __return_storage_ptr__->type = EndArray;
    }
    else {
      __fd = (int)input;
      if (uVar2 == 0x66) {
        std::__cxx11::string::string((string *)&local_80,"alse",(allocator *)&local_60);
        read(__fd,&local_80,__nbytes_01);
        std::__cxx11::string::~string((string *)&local_80);
        __return_storage_ptr__->type = False;
      }
      else if (uVar2 == 0x6e) {
        std::__cxx11::string::string((string *)&local_80,"ull",(allocator *)&local_60);
        read(__fd,&local_80,__nbytes_00);
        std::__cxx11::string::~string((string *)&local_80);
        __return_storage_ptr__->type = Null;
      }
      else if (uVar2 == 0x74) {
        std::__cxx11::string::string((string *)&local_80,"rue",(allocator *)&local_60);
        read(__fd,&local_80,__nbytes);
        std::__cxx11::string::~string((string *)&local_80);
        __return_storage_ptr__->type = True;
      }
      else if (uVar2 == 0x7b) {
        __return_storage_ptr__->type = BeginObject;
      }
      else {
        if (uVar2 != 0x5b) goto switchD_0010345a_caseD_23;
        __return_storage_ptr__->type = BeginArray;
      }
    }
    goto LAB_00103427;
  }
  switch(uVar2) {
  case 0x22:
    readString_abi_cxx11_
              (&local_80,(JsonLexer *)input,
               (istream *)
               ((long)&switchD_0010345a::switchdataD_001050b4 +
               (long)(int)(&switchD_0010345a::switchdataD_001050b4)[uVar2 - 0x22]));
    __return_storage_ptr__->type = String;
    break;
  default:
switchD_0010345a_caseD_23:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_40,'\x01');
    std::operator+(&local_60,"Found illegal character: \'",&local_40);
    std::operator+(&local_80,&local_60,"\'");
    std::runtime_error::runtime_error(this,(string *)&local_80);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 0x2c:
    __return_storage_ptr__->type = ValueSeparator;
    goto LAB_00103427;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    readNumber_abi_cxx11_(&local_80,(JsonLexer *)input,(istream *)(ulong)(uint)(int)c,c);
    __return_storage_ptr__->type = Number;
    break;
  case 0x3a:
    __return_storage_ptr__->type = NameSeparator;
LAB_00103427:
    (__return_storage_ptr__->value)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->value).field_2;
    (__return_storage_ptr__->value)._M_string_length = 0;
    (__return_storage_ptr__->value).field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  paVar1 = &(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p == &local_80.field_2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,local_80.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = local_80.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->value)._M_dataplus._M_p = local_80._M_dataplus._M_p;
    (__return_storage_ptr__->value).field_2._M_allocated_capacity =
         CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,local_80.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->value)._M_string_length = local_80._M_string_length;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

JsonToken JsonLexer::nextToken(std::istream &input)
    {
        char c;

        if (input >> c)
        {
            switch (c)
            {
            case '[':
                return {JsonTokenType::BeginArray};
            case '{':
                return {JsonTokenType::BeginObject};
            case ']':
                return {JsonTokenType::EndArray};
            case '}':
                return {JsonTokenType::EndObject};
            case ':':
                return {JsonTokenType::NameSeparator};
            case ',':
                return {JsonTokenType::ValueSeparator};
            case 'f':
                read(input, "alse"); // Make sure that the next characters in the stream are 'a', 'l', 's' and 'e'.
                return {JsonTokenType::False};
            case 't':
                read(input, "rue");
                return {JsonTokenType::True};
            case 'n':
                read(input, "ull");
                return {JsonTokenType::Null};
            case '-':
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                return {JsonTokenType::Number, readNumber(input, c)};
            case '\"':
                return {JsonTokenType::String, readString(input)};
            default:
                throw std::runtime_error("Found illegal character: '" + std::string(1, c) + "'");
            }
        }

        return {JsonTokenType::EndOfFile};
    }